

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<16,_7,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  float afStack_b8 [6];
  undefined8 local_a0;
  int local_98 [4];
  undefined8 local_88;
  undefined4 local_80;
  Matrix<float,_4,_2> local_78;
  Matrix<float,_4,_2> local_58;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_1c;
  undefined4 local_14;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_58.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_58.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_58.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_58.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_58.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_58.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_58.m_data.m_data[0].m_data[0] = -0.6;
    local_58.m_data.m_data[0].m_data[1] = -0.6;
    local_58.m_data.m_data[0].m_data[2] = -0.2;
    local_58.m_data.m_data[0].m_data[3] = -0.1;
    local_58.m_data.m_data[1].m_data[0] = -1.1;
    local_58.m_data.m_data[1].m_data[1] = -0.6;
    local_58.m_data.m_data[1].m_data[2] = -0.6;
    local_58.m_data.m_data[1].m_data[3] = -0.1;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_78.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_78.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_78.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_78.m_data.m_data[0].m_data[0] = -1.2;
    local_78.m_data.m_data[0].m_data[1] = 0.7;
    local_78.m_data.m_data[0].m_data[2] = 0.7;
    local_78.m_data.m_data[0].m_data[3] = -0.4;
    local_78.m_data.m_data[1].m_data[0] = -1.0;
    local_78.m_data.m_data[1].m_data[1] = -1.0;
    local_78.m_data.m_data[1].m_data[2] = 0.7;
    local_78.m_data.m_data[1].m_data[3] = -0.3;
  }
  tcu::operator-(&local_58,&local_78);
  local_a0 = local_30;
  local_98[0] = local_28;
  local_88 = local_1c;
  local_80 = local_14;
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  afStack_b8[4] = 0.0;
  lVar1 = 0;
  do {
    afStack_b8[lVar1 + 2] =
         *(float *)((long)&local_a0 + lVar1 * 4) + *(float *)((long)&local_88 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_98[0] = 0;
  local_98[1] = 1;
  local_98[2] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_a0 + lVar1 * 4)] = afStack_b8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}